

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O2

void ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  bool bVar1;
  uchar value;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  unsigned_long uVar5;
  uint distance;
  uint count;
  uint first_byte;
  pos_type pVar6;
  uint descriptor_bits_remaining;
  anon_class_16_2_3e1545d2 PopDescriptorBit;
  BitField<decltype(input)> descriptor_bits;
  uint local_64;
  streamoff local_60;
  anon_class_16_2_3e1545d2 local_58;
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  local_48;
  
  pVar6 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
          ::Tell(&output->
                  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                );
  local_60 = pVar6._M_off;
  uVar5 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::Read<2U,_(ClownLZSS::Internal::Endian)1>
                    ((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
  local_64 = (uint)uVar5;
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader(&local_48,input);
  local_58.descriptor_bits_remaining = &local_64;
  local_58.descriptor_bits = &local_48;
  while ((int)uVar5 != 0) {
    bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
            ::anon_class_16_2_3e1545d2::operator()(&local_58);
    if (bVar1) {
      value = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>::
      WriteImplementation(output,value);
    }
    else {
      bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
              ::anon_class_16_2_3e1545d2::operator()(&local_58);
      bVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      if (bVar1) {
        bVar3 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::ReadImplementation
                          (&input->
                            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          );
        distance = (uint)bVar2 + (bVar3 & 0xffffffe0) * 8 + 1;
        count = (bVar3 & 0x1f) + 3;
      }
      else {
        distance = 0x100 - bVar2;
        bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
                ::anon_class_16_2_3e1545d2::operator()(&local_58);
        bVar4 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
                ::anon_class_16_2_3e1545d2::operator()(&local_58);
        count = (uint)bVar4 + (uint)bVar1 * 2 + 2;
      }
      pVar6 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
              ::Tell(&output->
                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                    );
      if ((uint)((int)pVar6._M_off - (int)local_60) < distance) {
        OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
        ::Fill((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                *)output,'\0',count);
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>::
        Copy(output,distance,count);
      }
    }
    uVar5 = (unsigned_long)local_64;
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				const auto output_start_position = output.Tell();

				unsigned int descriptor_bits_remaining = input.ReadLE16();

				BitField<decltype(input)> descriptor_bits(input);

				const auto PopDescriptorBit = [&]()
				{
					--descriptor_bits_remaining;
					return descriptor_bits.Pop();
				};

				while (descriptor_bits_remaining != 0)
				{
					if (PopDescriptorBit())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						unsigned int distance, count;

						if (PopDescriptorBit())
						{
							const unsigned int first_byte = input.Read();
							const unsigned int second_byte = input.Read();

							distance = (first_byte | ((second_byte << 3) & 0x700)) + 1;
							count = (second_byte & 0x1F) + 3;
						}
						else
						{
							distance = 0x100 - input.Read();
							count = 2;

							if (PopDescriptorBit())
								count += 2;
							if (PopDescriptorBit())
								count += 1;
						}

						const unsigned int output_position = output.Distance(output_start_position);

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}